

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

QXmlStreamEntityDeclarations * __thiscall
QXmlStreamReader::entityDeclarations
          (QXmlStreamEntityDeclarations *__return_storage_ptr__,QXmlStreamReader *this)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  Data *pDVar1;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  if (*(qsizetype *)((long)&(this_00._M_head_impl)->entityDeclarations + 8) != -1) {
    QXmlStreamReaderPrivate::resolveDtd(this_00._M_head_impl);
  }
  pDVar1 = ((this_00._M_head_impl)->publicEntityDeclarations).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr =
       *(QXmlStreamEntityDeclaration **)
        ((long)&(this_00._M_head_impl)->publicEntityDeclarations + 8);
  (__return_storage_ptr__->d).size =
       *(qsizetype *)((long)&(this_00._M_head_impl)->publicEntityDeclarations + 0x10);
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QXmlStreamEntityDeclarations QXmlStreamReader::entityDeclarations() const
{
    Q_D(const QXmlStreamReader);
    if (d->entityDeclarations.size())
        const_cast<QXmlStreamReaderPrivate *>(d)->resolveDtd();
    return d->publicEntityDeclarations;
}